

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O3

void func_call_virtual(size_t n)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  size_t sVar4;
  ostream *poVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  size_t res;
  long local_38;
  double local_30;
  
  local_38 = 0;
  lVar1 = std::chrono::_V2::system_clock::now();
  plVar2 = (long *)operator_new(8);
  *plVar2 = (long)&PTR_f_00109cf0;
  iVar6 = 0x10000000;
  do {
    lVar3 = (**(code **)*plVar2)(plVar2,&local_38,n);
    local_38 = local_38 + lVar3;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  lVar3 = std::chrono::_V2::system_clock::now();
  side_effect = side_effect + ((uint)local_38 & 1);
  (**(code **)(*plVar2 + 0x10))(plVar2);
  dVar7 = (double)(lVar3 - lVar1) / 1000000000.0;
  dVar8 = dVar7 * 1000.0 * 1000.0 * 1000.0 * 3.725290298461914e-09;
  local_30 = ((268435456.0 / dVar7) / 1000.0) / 1000.0;
  expand_name("func_call_virtual");
  sVar4 = strlen(expand_name::buf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,expand_name::buf,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar5 = std::ostream::_M_insert<double>(dVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ns per operation,\t",0x12);
  poVar5 = std::ostream::_M_insert<double>(dVar8 / unit);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ticks,\t",8);
  poVar5 = std::ostream::_M_insert<double>(local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," Mrps",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

static void __attribute__((noinline))
func_call_virtual(size_t n)
{
    size_t res = 0;
    now_t start = now();
    const size_t COUNT = 0x10000000;
    A *a = new B;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        size_t x = a->f(res, n);
        res += x;
    }
    now_t stop = now();
    side_effect += res % 2;
    delete a;


    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;
}